

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::End(void)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *local_40;
  ImVec2 local_30;
  ImVec2 local_28;
  ImGuiWindow *local_20;
  ImGuiWindow *host_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window = (ImGuiWindow *)GImGui;
  host_window = GImGui->CurrentWindow;
  if (((GImGui->CurrentWindowStack).Size < 2) &&
     ((GImGui->WithinFrameScopeWithImplicitWindow & 1U) != 0)) {
    if ((GImGui->CurrentWindowStack).Size < 2) {
      __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1a58,"void ImGui::End()");
    }
  }
  else {
    if ((GImGui->CurrentWindowStack).Size < 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1a5b,"void ImGui::End()");
    }
    if (((((host_window->Flags & 0x1000000U) != 0) && ((host_window->Flags & 0x20000000U) == 0)) &&
        ((host_window->field_0x492 & 1) == 0)) && ((GImGui->WithinEndChild & 1U) == 0)) {
      __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x1a5f,"void ImGui::End()");
    }
    if ((host_window->DC).CurrentColumns != (ImGuiColumns *)0x0) {
      EndColumns();
    }
    if ((host_window->Flags & 0x20000000U) == 0) {
      PopClipRect();
    }
    if ((host_window->Flags & 0x1000000U) == 0) {
      LogFinish();
    }
    if (((host_window->DockNode != (ImGuiDockNode *)0x0) &&
        (((byte)host_window->field_0x492 >> 1 & 1) != 0)) &&
       (local_20 = host_window->DockNode->HostWindow, local_20 != (ImGuiWindow *)0x0)) {
      local_30 = operator+(&(host_window->DC).CursorMaxPos,&host_window->WindowPadding);
      local_28 = operator-(&local_30,&local_20->WindowPadding);
      (local_20->DC).CursorMaxPos = local_28;
    }
    ImVector<ImGuiWindow_*>::pop_back((ImVector<ImGuiWindow_*> *)&window[5].DockNodeAsHost);
    if ((host_window->Flags & 0x4000000U) != 0) {
      ImVector<ImGuiPopupData>::pop_back((ImVector<ImGuiPopupData> *)&window[6].DC.MenuBarOffset);
    }
    ErrorCheckBeginEndCompareStacksSize(host_window,false);
    bVar1 = ImVector<ImGuiWindow_*>::empty((ImVector<ImGuiWindow_*> *)&window[5].DockNodeAsHost);
    if (bVar1) {
      local_40 = (ImGuiWindow *)0x0;
    }
    else {
      ppIVar2 = ImVector<ImGuiWindow_*>::back((ImVector<ImGuiWindow_*> *)&window[5].DockNodeAsHost);
      local_40 = *ppIVar2;
    }
    SetCurrentWindow(local_40);
    if (window[6].Name != (char *)0x0) {
      SetCurrentViewport((ImGuiWindow *)window[6].Name,*(ImGuiViewportP **)(window[6].Name + 0x30));
    }
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !(window->Flags & ImGuiWindowFlags_DockNodeHost) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    ErrorCheckBeginEndCompareStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}